

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

void __thiscall Potassco::SmodelsConvert::flushMinimize(SmodelsConvert *this)

{
  _Rb_tree_color _Var1;
  SmData *pSVar2;
  AbstractProgram *pAVar3;
  SmData *this_00;
  _Base_ptr p_Var4;
  Span<Potassco::WeightLit_t> local_50;
  Span<Potassco::WeightLit_t> local_40;
  
  pSVar2 = this->data_;
  for (p_Var4 = (pSVar2->minimize_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pSVar2->minimize_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pAVar3 = this->out_;
    _Var1 = p_Var4[1]._M_color;
    this_00 = this->data_;
    local_50 = toSpan<std::vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>>
                         ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                          &p_Var4[1]._M_parent);
    local_40 = SmData::mapLits<Potassco::WeightLit_t>(this_00,&local_50,&this->data_->wlits_);
    (*pAVar3->_vptr_AbstractProgram[6])(pAVar3,(ulong)_Var1,&local_40);
  }
  return;
}

Assistant:

void SmodelsConvert::flushMinimize() {
	for (SmData::MinMap::iterator it = data_->minimize_.begin(), end = data_->minimize_.end(); it != end; ++it) {
		out_.minimize(it->first, data_->mapLits(toSpan(it->second), data_->wlits_));
	}
}